

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

void prepdelem(rnndb *db,rnndelem *elem,char *prefix,rnnvarinfo *parvi,int width)

{
  int iVar1;
  rnndelem **pprVar2;
  rnndelem *prVar3;
  char *pcVar4;
  char *pcVar5;
  char *local_88;
  char *local_70;
  char *local_58;
  char *tmp;
  rnngroup *prStack_38;
  int i;
  rnngroup *gr;
  int i_1;
  int width_local;
  rnnvarinfo *parvi_local;
  char *prefix_local;
  rnndelem *elem_local;
  rnndb *db_local;
  
  if (elem->type == RNN_ETYPE_USE_GROUP) {
    prStack_38 = (rnngroup *)0x0;
    for (gr._0_4_ = 0; (int)gr < db->groupsnum; gr._0_4_ = (int)gr + 1) {
      iVar1 = strcmp(db->groups[(int)gr]->name,elem->name);
      if (iVar1 == 0) {
        prStack_38 = db->groups[(int)gr];
        break;
      }
    }
    if (prStack_38 == (rnngroup *)0x0) {
      fprintf(_stderr,"group %s not found!\n",elem->name);
      db->estatus = 1;
    }
    else {
      for (gr._0_4_ = 0; (int)gr < prStack_38->subelemsnum; gr._0_4_ = (int)gr + 1) {
        if (elem->subelemsmax <= elem->subelemsnum) {
          if (elem->subelemsmax == 0) {
            elem->subelemsmax = 0x10;
          }
          else {
            elem->subelemsmax = elem->subelemsmax << 1;
          }
          pprVar2 = (rnndelem **)realloc(elem->subelems,(long)elem->subelemsmax << 3);
          elem->subelems = pprVar2;
        }
        prVar3 = copydelem(prStack_38->subelems[(int)gr],elem->file);
        iVar1 = elem->subelemsnum;
        elem->subelemsnum = iVar1 + 1;
        elem->subelems[iVar1] = prVar3;
      }
    }
    elem->type = RNN_ETYPE_STRIPE;
    elem->length = 1;
    free(elem->name);
    elem->name = (char *)0x0;
  }
  if (elem->name != (char *)0x0) {
    pcVar4 = catstr(prefix,elem->name);
    elem->fullname = pcVar4;
  }
  local_58 = prefix;
  if (elem->fullname != (char *)0x0) {
    local_58 = elem->fullname;
  }
  prepvarinfo(db,local_58,&elem->varinfo,parvi);
  if ((elem->varinfo).dead == 0) {
    if ((elem->length != 1) && (elem->stride == 0)) {
      if (elem->type == RNN_ETYPE_REG) {
        elem->stride = (long)(elem->width / width);
      }
      else {
        fprintf(_stderr,"%s has non-1 length, but no stride!\n",elem->fullname);
        db->estatus = 1;
      }
    }
    local_70 = prefix;
    if (elem->name != (char *)0x0) {
      local_70 = elem->fullname;
    }
    preptypeinfo(db,&elem->typeinfo,local_70,&elem->varinfo,elem->width,elem->file);
    for (tmp._4_4_ = 0; tmp._4_4_ < elem->subelemsnum; tmp._4_4_ = tmp._4_4_ + 1) {
      local_88 = prefix;
      if (elem->name != (char *)0x0) {
        local_88 = elem->fullname;
      }
      prepdelem(db,elem->subelems[tmp._4_4_],local_88,&elem->varinfo,width);
    }
    if (((elem->varinfo).prefix != (char *)0x0) && (elem->name != (char *)0x0)) {
      pcVar4 = elem->fullname;
      pcVar5 = catstr((elem->varinfo).prefix,elem->fullname);
      elem->fullname = pcVar5;
      free(pcVar4);
    }
  }
  return;
}

Assistant:

static void prepdelem(struct rnndb *db, struct rnndelem *elem, char *prefix, struct rnnvarinfo *parvi, int width) {
	if (elem->type == RNN_ETYPE_USE_GROUP) {
		int i;
		struct rnngroup *gr = 0;
		for (i = 0; i < db->groupsnum; i++)
			if (!strcmp(db->groups[i]->name, elem->name)) {
				gr = db->groups[i];
				break;
			}
		if (gr) {
			for (i = 0; i < gr->subelemsnum; i++)
				ADDARRAY(elem->subelems, copydelem(gr->subelems[i], elem->file));
		} else {
			fprintf (stderr, "group %s not found!\n", elem->name);
			db->estatus = 1;
		}
		elem->type = RNN_ETYPE_STRIPE;
		elem->length = 1;
		free(elem->name);
		elem->name = 0;
	}
	if (elem->name)
		elem->fullname = catstr(prefix, elem->name);
	prepvarinfo (db, elem->fullname?elem->fullname:prefix, &elem->varinfo, parvi);
	if (elem->varinfo.dead)
		return;
	if (elem->length != 1 && !elem->stride) {
		if (elem->type != RNN_ETYPE_REG) {
			fprintf (stderr, "%s has non-1 length, but no stride!\n", elem->fullname);
			db->estatus = 1;
		} else {
			elem->stride = elem->width/width;
		}
	}
	preptypeinfo(db, &elem->typeinfo, elem->name?elem->fullname:prefix, &elem->varinfo, elem->width, elem->file);

	int i;
	for (i = 0; i < elem->subelemsnum; i++)
		prepdelem(db,  elem->subelems[i], elem->name?elem->fullname:prefix, &elem->varinfo, width);
	if (elem->varinfo.prefix && elem->name) {
		char *tmp = elem->fullname;
		elem->fullname = catstr(elem->varinfo.prefix, elem->fullname);
		free(tmp);
	}
}